

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync_tests.cpp
# Opt level: O0

void (anonymous_namespace)::TestInconsistentLockOrderDetected<AnnotatedMixin<std::mutex>>
               (AnnotatedMixin<std::mutex> *mutex1,AnnotatedMixin<std::mutex> *mutex2)

{
  bool bVar1;
  long in_FS_OFFSET;
  string lockname_1;
  string lockname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  char *in_stack_fffffffffffffed8;
  assertion_result *this;
  string *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  lazy_ostream *in_stack_fffffffffffffef0;
  undefined1 *line_num;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 uVar2;
  unit_test_log_t *this_00;
  const_string local_c0 [2];
  lazy_ostream local_a0 [2];
  assertion_result local_80 [2];
  undefined1 local_48 [32];
  long lVar3;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  EnterCritical<AnnotatedMixin<std::mutex>>
            (in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
             (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
             (AnnotatedMixin<std::mutex> *)
             CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0));
  AnnotatedMixin<std::mutex>::lock((AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffec8);
  EnterCritical<AnnotatedMixin<std::mutex>>
            (in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
             (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
             (AnnotatedMixin<std::mutex> *)
             CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0));
  AnnotatedMixin<std::mutex>::lock((AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffec8);
  this_00 = (unit_test_log_t *)&stack0xffffffffffffffd8;
  std::__cxx11::string::string(in_stack_fffffffffffffee0);
  CheckLastCritical(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                    (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                    (int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
  AnnotatedMixin<std::mutex>::unlock((AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffec8);
  LeaveCritical();
  std::__cxx11::string::~string(in_stack_fffffffffffffec8);
  line_num = local_48;
  std::__cxx11::string::string(in_stack_fffffffffffffee0);
  CheckLastCritical(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                    (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                    (int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
  AnnotatedMixin<std::mutex>::unlock((AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffec8);
  LeaveCritical();
  std::__cxx11::string::~string(in_stack_fffffffffffffec8);
  do {
    this = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)boost::unit_test::(anonymous_namespace)::unit_test_log,
               (pointer)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               (unsigned_long)in_stack_fffffffffffffec8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffec8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,(const_string *)CONCAT44(uVar2,in_stack_ffffffffffffff00),(size_t)line_num,
               (const_string *)in_stack_fffffffffffffef0);
    LockStackEmpty();
    boost::test_tools::assertion_result::assertion_result(this,(bool)in_stack_fffffffffffffed7);
    in_stack_fffffffffffffef0 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this,
               (pointer)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               (unsigned_long)in_stack_fffffffffffffec8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffec8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this,
               (pointer)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               (unsigned_long)in_stack_fffffffffffffec8);
    in_stack_fffffffffffffec8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_80,local_a0,local_c0,0x4c,CHECK,CHECK_PRED)
    ;
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffec8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffec8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestInconsistentLockOrderDetected(MutexType& mutex1, MutexType& mutex2) NO_THREAD_SAFETY_ANALYSIS
{
    ENTER_CRITICAL_SECTION(mutex1);
    ENTER_CRITICAL_SECTION(mutex2);
#ifdef DEBUG_LOCKORDER
    BOOST_CHECK_EXCEPTION(LEAVE_CRITICAL_SECTION(mutex1), std::logic_error, HasReason("mutex1 was not most recent critical section locked"));
#endif // DEBUG_LOCKORDER
    LEAVE_CRITICAL_SECTION(mutex2);
    LEAVE_CRITICAL_SECTION(mutex1);
    BOOST_CHECK(LockStackEmpty());
}